

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void * curve_new(t_symbol *classsym,int argc,t_atom *argv)

{
  t_float tVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  t_pd *object;
  _glist *p_Var6;
  ulong uVar7;
  t_pd fd;
  uint uVar8;
  ulong uVar9;
  char *flag;
  word *pwVar10;
  bool bVar11;
  
  object = pd_new(curve_class);
  pcVar2 = classsym->s_name;
  p_Var6 = canvas_getcurrent();
  object[0x1d] = (t_pd)p_Var6;
  bVar11 = *pcVar2 == 'f';
  uVar7 = (ulong)bVar11;
  uVar9 = (ulong)(bVar11 + 2);
  if (pcVar2[uVar7 * 2 + 4] != 'c') {
    uVar9 = uVar7;
  }
  *(undefined2 *)(object + 0x16) = 1;
  *(undefined4 *)(object + 0x17) = 0x3f800000;
  object[0x18] = (t_pd)0x0;
  object[0x19] = (t_pd)0x0;
  *(undefined4 *)(object + 0x1a) = 0;
  bVar11 = argc != 0;
  if ((bVar11) && (argv->a_type == A_SYMBOL)) {
    while (pcVar2 = ((argv->a_w).w_symbol)->s_name, *pcVar2 == '-') {
      iVar3 = strcmp(pcVar2,"-n");
      if (iVar3 == 0) {
        *(undefined2 *)(object + 0x16) = 1;
        *(undefined4 *)(object + 0x17) = 0;
        *(undefined4 *)(object + 0x1a) = 0;
        object[0x18] = (t_pd)0x0;
        object[0x19] = (t_pd)0x0;
      }
      else {
        iVar3 = strcmp(pcVar2,"-v");
        if ((argc < 2) || (iVar3 != 0)) {
          iVar3 = strcmp(pcVar2,"-x");
          uVar8 = (uint)uVar9;
          if (iVar3 == 0) {
            uVar9 = (ulong)(uVar8 | 0xc);
          }
          else {
            iVar3 = strcmp(pcVar2,"-xr");
            if (iVar3 == 0) {
              uVar9 = (ulong)(uVar8 | 4);
            }
            else {
              iVar3 = strcmp(pcVar2,"-xe");
              if (iVar3 == 0) {
                uVar9 = (ulong)(uVar8 | 8);
              }
              else {
                iVar3 = strcmp(pcVar2,"-xv");
                if (iVar3 == 0) {
                  uVar9 = (ulong)(uVar8 | 0x10);
                }
                else {
                  pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,pcVar2);
                }
              }
            }
          }
        }
        else {
          if (argv[1].a_type == A_SYMBOL) {
            fielddesc_setfloat_var((_fielddesc *)(object + 0x16),argv[1].a_w.w_symbol);
          }
          else {
            tVar1 = argv[1].a_w.w_float;
            *(undefined2 *)(object + 0x16) = 1;
            *(t_float *)(object + 0x17) = tVar1;
            object[0x18] = (t_pd)0x0;
            object[0x19] = (t_pd)0x0;
            *(undefined4 *)(object + 0x1a) = 0;
          }
          argv = argv + 1;
          argc = argc + -1;
        }
      }
      argv = argv + 1;
      argc = argc + -1;
      bVar11 = argc != 0;
      if ((argc == 0) || (argv->a_type != A_SYMBOL)) break;
    }
  }
  *(int *)(object + 6) = (int)uVar9;
  if (((uVar9 & 1) == 0) || (!bVar11)) {
    *(undefined2 *)(object + 7) = 1;
    *(undefined4 *)(object + 8) = 0;
    object[9] = (t_pd)0x0;
    object[10] = (t_pd)0x0;
    *(undefined4 *)(object + 0xb) = 0;
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 7),argc,argv);
    argv = argv + 1;
    argc = argc + -1;
  }
  if (argc == 0) {
    *(undefined2 *)(object + 0xc) = 1;
    iVar3 = 0;
    *(undefined4 *)(object + 0xd) = 0;
    object[0xe] = (t_pd)0x0;
    object[0xf] = (t_pd)0x0;
    *(undefined4 *)(object + 0x10) = 0;
  }
  else {
    iVar3 = argc + -1;
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argc,argv);
    argv = argv + 1;
  }
  if (iVar3 == 0) {
    *(undefined2 *)(object + 0x11) = 1;
    *(undefined4 *)(object + 0x12) = 0x3f800000;
    object[0x13] = (t_pd)0x0;
    object[0x14] = (t_pd)0x0;
    *(undefined4 *)(object + 0x15) = 0;
    uVar8 = 0;
  }
  else {
    uVar8 = iVar3 - 1;
    fielddesc_setfloatarg((_fielddesc *)(object + 0x11),iVar3,argv);
    argv = argv + 1;
  }
  uVar4 = 0;
  if (0 < (int)uVar8) {
    uVar4 = uVar8;
  }
  uVar5 = uVar4 + (uVar4 & 1);
  *(uint *)(object + 0x1b) = uVar5 >> 1;
  fd = (t_pd)getbytes((ulong)uVar5 * 0x28);
  object[0x1c] = fd;
  if (0 < (int)uVar8) {
    pwVar10 = &argv->a_w;
    do {
      if (((t_atom *)(pwVar10 + -1))->a_type == A_SYMBOL) {
        fielddesc_setfloat_var((_fielddesc *)fd,pwVar10->w_symbol);
      }
      else {
        tVar1 = pwVar10->w_float;
        *(undefined2 *)&fd->c_name = 1;
        *(t_float *)&fd->c_helpname = tVar1;
        fd->c_externdir = (t_symbol *)0x0;
        fd->c_size = 0;
        *(undefined4 *)&fd->c_methods = 0;
      }
      fd = (t_pd)&fd->c_nmethod;
      pwVar10 = pwVar10 + 2;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if ((uVar4 & 1) != 0) {
    *(undefined2 *)&fd->c_name = 1;
    *(undefined4 *)&fd->c_helpname = 0;
    fd->c_externdir = (t_symbol *)0x0;
    fd->c_size = 0;
    *(undefined4 *)&fd->c_methods = 0;
  }
  return object;
}

Assistant:

static void *curve_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_curve *x = (t_curve *)pd_new(curve_class);
    const char *classname = classsym->s_name;
    int flags = 0;
    int nxy, i;
    t_fielddesc *fd;
    x->x_canvas = canvas_getcurrent();
    if (classname[0] == 'f')
    {
        classname += 6;
        flags |= CLOSED;
    }
    else classname += 4;
    if (classname[0] == 'c') flags |= BEZ;
    fielddesc_setfloat_const(&x->x_vis, 1);
    while (argc && argv->a_type == A_SYMBOL &&
        *argv->a_w.w_symbol->s_name == '-')
    {
        const char *flag = argv->a_w.w_symbol->s_name;
        if (!strcmp(flag, "-n"))
        {
            fielddesc_setfloat_const(&x->x_vis, 0);
        }
        else if (!strcmp(flag, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 1; argv += 1;
        }
        else if (!strcmp(flag, "-x"))
        {
            /* disable all mouse interaction */
            flags |= (NOMOUSERUN | NOMOUSEEDIT);
        }
        else if (!strcmp(flag, "-xr"))
        {
            /* disable mouse actions in run mode */
            flags |= NOMOUSERUN;
        }
        else if (!strcmp(flag, "-xe"))
        {
            /* disable mouse actions in edit mode */
            flags |= NOMOUSEEDIT;
        }
        else if (!strcmp(flag, "-xv"))
        {
            /* disable changing vertices in run mode */
            flags |= NOVERTICES;
        }
        else
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                flag);
        }
        argc--; argv++;
    }
    x->x_flags = flags;
    if ((flags & CLOSED) && argc)
        fielddesc_setfloatarg(&x->x_fillcolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_fillcolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc < 0) argc = 0;
    nxy =  (argc + (argc & 1));
    x->x_npoints = (nxy>>1);
    x->x_vec = (t_fielddesc *)t_getbytes(nxy * sizeof(t_fielddesc));
    for (i = 0, fd = x->x_vec; i < argc; i++, fd++, argv++)
        fielddesc_setfloatarg(fd, 1, argv);
    if (argc & 1) fielddesc_setfloat_const(fd, 0);

    return (x);
}